

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O3

mFILE * mfreopen(char *path,char *mode_str,FILE *fp)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  mFILE *pmVar6;
  size_t sVar7;
  int binary;
  undefined8 in_RCX;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  
  pcVar2 = strchr(mode_str,0x72);
  bVar9 = pcVar2 != (char *)0x0;
  pcVar2 = strchr(mode_str,0x77);
  uVar8 = bVar9 + 0x12;
  if (pcVar2 == (char *)0x0) {
    uVar8 = (uint)bVar9;
  }
  pcVar3 = strchr(mode_str,0x61);
  bVar10 = pcVar3 != (char *)0x0;
  uVar1 = uVar8 | 6;
  if (!bVar10) {
    uVar1 = uVar8;
  }
  pcVar4 = strchr(mode_str,0x62);
  uVar8 = uVar1 + 8;
  if (pcVar4 == (char *)0x0) {
    uVar8 = uVar1;
  }
  pcVar4 = strchr(mode_str,0x78);
  pcVar5 = strchr(mode_str,0x2b);
  bVar11 = pcVar5 != (char *)0x0;
  uVar1 = uVar8 | 3;
  if (!bVar11) {
    uVar1 = uVar8;
  }
  binary = (int)CONCAT71((int7)((ulong)in_RCX >> 8),bVar11 && bVar10);
  if (bVar9 || bVar11 && bVar10) {
    pmVar6 = (mFILE *)malloc(0x38);
    if (pmVar6 == (mFILE *)0x0) {
      return (mFILE *)0x0;
    }
    *(undefined8 *)((long)&pmVar6->data + 4) = 0;
    *(undefined8 *)((long)&pmVar6->alloced + 4) = 0;
    pmVar6->fp = (FILE *)0x0;
    pmVar6->data = (char *)0x0;
    pmVar6->size = 0;
    pmVar6->offset = 0;
    pmVar6->flush_pos = 0;
    pmVar6->mode = 3;
    if ((uVar1 & 0x10) == 0) {
      pcVar2 = mfload(fp,path,&pmVar6->size,binary);
      pmVar6->data = pcVar2;
      sVar7 = pmVar6->size;
      pmVar6->alloced = sVar7;
      if (pcVar3 == (char *)0x0) {
        fseek((FILE *)fp,0,0);
        pmVar6->fp = fp;
        uVar8 = uVar1 | 0x20;
        if (pcVar4 == (char *)0x0) {
          uVar8 = uVar1;
        }
        pmVar6->mode = uVar8;
        return pmVar6;
      }
      pmVar6->fp = fp;
      uVar8 = uVar1 | 0x20;
      if (pcVar4 == (char *)0x0) {
        uVar8 = uVar1;
      }
      pmVar6->mode = uVar8;
      goto LAB_0012f356;
    }
  }
  else {
    if ((pcVar5 == (char *)0x0 && pcVar3 == (char *)0x0) && pcVar2 == (char *)0x0) {
      mfreopen_cold_1();
      return (mFILE *)0x0;
    }
    pmVar6 = (mFILE *)malloc(0x38);
    if (pmVar6 == (mFILE *)0x0) {
      return (mFILE *)0x0;
    }
    *(undefined8 *)((long)&pmVar6->data + 4) = 0;
    *(undefined8 *)((long)&pmVar6->alloced + 4) = 0;
    pmVar6->fp = (FILE *)0x0;
    pmVar6->data = (char *)0x0;
    pmVar6->size = 0;
    pmVar6->offset = 0;
    pmVar6->flush_pos = 0;
    pmVar6->mode = 3;
  }
  uVar8 = uVar1 | 0x20;
  if (pcVar4 == (char *)0x0) {
    uVar8 = uVar1;
  }
  pmVar6->fp = fp;
  pmVar6->mode = uVar8;
  if (pcVar3 == (char *)0x0) {
    return pmVar6;
  }
  sVar7 = 0;
LAB_0012f356:
  pmVar6->flush_pos = sVar7;
  fseek((FILE *)fp,0,2);
  return pmVar6;
}

Assistant:

mFILE *mfreopen(const char *path, const char *mode_str, FILE *fp) {
    mFILE *mf;
    int r = 0, w = 0, a = 0, b = 0, x = 0, mode = 0;

    /* Parse mode:
     * r = read file contents (if truncated => don't read)
     * w = write on close
     * a = position at end of buffer
     * x = position at same location as the original fp, don't seek on flush
     */
    if (strchr(mode_str, 'r'))
	r = 1, mode |= MF_READ;
    if (strchr(mode_str, 'w'))
	w = 1, mode |= MF_WRITE | MF_TRUNC;
    if (strchr(mode_str, 'a'))
	w = a = 1, mode |= MF_WRITE | MF_APPEND;
    if (strchr(mode_str, 'b'))
	b = 1, mode |= MF_BINARY;
    if (strchr(mode_str, 'x'))
	x = 1;
    if (strchr(mode_str, '+')) {
        w = 1, mode |= MF_READ | MF_WRITE;
	if (a)
	    r = 1;
    }

    if (r) {
	mf = mfcreate(NULL, 0);
	if (NULL == mf) return NULL;
	if (!(mode & MF_TRUNC)) {
	    mf->data = mfload(fp, path, &mf->size, b);
	    mf->alloced = mf->size;
	    if (!a)
		fseek(fp, 0, SEEK_SET);
	}
    } else if (w) {
	/* Write - initialise the data structures */
	mf = mfcreate(NULL, 0);
	if (NULL == mf) return NULL;
    } else {
        fprintf(stderr, "Must specify either r, w or a for mode\n");
        return NULL;
    }
    mf->fp = fp;
    mf->mode = mode;

    if (x) {
	mf->mode |= MF_MODEX;
    }
    
    if (a) {
	mf->flush_pos = mf->size;
	fseek(fp, 0, SEEK_END);
    }

    return mf;
}